

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O1

string * llbuild::basic::sys::makeTmpDir_abi_cxx11_(void)

{
  char *pcVar1;
  string *tmpDirString;
  string *in_RDI;
  char *tmpDirPath;
  allocator local_29;
  char *local_28;
  char acStack_20 [16];
  
  pcVar1 = getenv("TMPDIR");
  if (pcVar1 == (char *)0x0) {
    local_28 = (char *)0x6c69662f706d742f;
    builtin_strncpy(acStack_20,"eXXXXXX",8);
    pcVar1 = mkdtemp((char *)&local_28);
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_29);
  }
  else {
    local_28 = (char *)0x0;
    asprintf(&local_28,"%s/fileXXXXXX",pcVar1);
    pcVar1 = mkdtemp(local_28);
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_29);
    free(local_28);
  }
  return in_RDI;
}

Assistant:

std::string sys::makeTmpDir() {
#if defined(_WIN32)
  char path[MAX_PATH];
  tmpnam_s(path, MAX_PATH);
  llvm::SmallVector<llvm::UTF16, 20> wPath;
  llvm::convertUTF8ToUTF16String(path, wPath);
  CreateDirectoryW((LPCWSTR)wPath.data(), NULL);
  return std::string(path);
#else
  if (const char *tmpDir = std::getenv("TMPDIR")) {
    char *tmpDirPath = nullptr;
    asprintf(&tmpDirPath, "%s/fileXXXXXX", tmpDir);
    auto tmpDirString = std::string(mkdtemp(tmpDirPath));
    free(tmpDirPath);
    return tmpDirString;
  }
  else {
    char tmpDirPathBuf[] = "/tmp/fileXXXXXX";
    return std::string(mkdtemp(tmpDirPathBuf));
  }
#endif
}